

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O2

int si9ma::Trie::search(TrieNode *root,string *str)

{
  int i;
  size_type sVar1;
  TrieNode *cur;
  
  sVar1 = 0;
  do {
    if (str->_M_string_length == sVar1) {
      return root->end;
    }
    root = *(TrieNode **)((long)root + (long)(str->_M_dataplus)._M_p[sVar1] * 8 + -0x300);
    sVar1 = sVar1 + 1;
  } while (root != (TrieNode *)0x0);
  return 0;
}

Assistant:

int Trie::search(TrieNode *root,const string &str) {
        auto *cur = root;

        for (int i = 0; i < str.length(); ++i) {
            int index = str[i] - 'a';

            if (cur->nexts[index] == nullptr){
                return 0;
            }
            cur = cur->nexts[index];
        }

        return cur->end;
    }